

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O1

void __thiscall xmrig::JobResultsPrivate::submit(JobResultsPrivate *this)

{
  bool bVar1;
  size_t sVar2;
  IJobResultListener *pIVar3;
  _List_node_base *p_Var4;
  int iVar5;
  void *pvVar6;
  undefined8 uVar7;
  _List_node_base *p_Var8;
  list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> bundles;
  list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> results;
  _List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> local_50;
  _List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> local_38;
  
  local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50._M_impl._M_node._M_size = 0;
  local_38._M_impl._M_node._M_size = 0;
  local_50._M_impl._M_node.super__List_node_base._M_prev =
       local_50._M_impl._M_node.super__List_node_base._M_next;
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar5 == 0) {
    std::__detail::_List_node_base::swap
              ((_List_node_base *)&this->m_bundles,(_List_node_base *)&local_50);
    sVar2 = (this->m_bundles).super__List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>.
            _M_impl._M_node._M_size;
    (this->m_bundles).super__List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>._M_impl.
    _M_node._M_size = local_50._M_impl._M_node._M_size;
    local_50._M_impl._M_node._M_size = sVar2;
    std::__detail::_List_node_base::swap
              ((_List_node_base *)&this->m_results,(_List_node_base *)&local_38);
    sVar2 = (this->m_results).super__List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>.
            _M_impl._M_node._M_size;
    (this->m_results).super__List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>._M_impl.
    _M_node._M_size = local_38._M_impl._M_node._M_size;
    local_38._M_impl._M_node._M_size = sVar2;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    p_Var8 = (_List_node_base *)&local_38;
    while (p_Var4 = local_50._M_impl._M_node.super__List_node_base._M_next, p_Var8 = p_Var8->_M_next
          , p_Var8 != (_List_node_base *)&local_38) {
      (*this->m_listener->_vptr_IJobResultListener[2])(this->m_listener,p_Var8 + 1);
    }
    if (local_50._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_50) {
      pvVar6 = operator_new(200);
      pIVar3 = this->m_listener;
      bVar1 = this->m_hwAES;
      *(void **)pvVar6 = pvVar6;
      *(bool *)((long)pvVar6 + 0x80) = bVar1;
      *(IJobResultListener **)((long)pvVar6 + 0x88) = pIVar3;
      *(_List_node_base **)((long)pvVar6 + 0x90) = p_Var4;
      *(_List_node_base **)((long)pvVar6 + 0x98) =
           local_50._M_impl._M_node.super__List_node_base._M_prev;
      *(size_t *)((long)pvVar6 + 0xa0) = local_50._M_impl._M_node._M_size;
      (local_50._M_impl._M_node.super__List_node_base._M_prev)->_M_next =
           (_List_node_base *)((long)pvVar6 + 0x90);
      *(_List_node_base **)(*(long *)((long)pvVar6 + 0x90) + 8) =
           (_List_node_base *)((long)pvVar6 + 0x90);
      local_50._M_impl._M_node._M_size = 0;
      *(undefined8 *)((long)pvVar6 + 0xb4) = 0;
      *(undefined8 *)((long)pvVar6 + 0xbc) = 0;
      *(undefined8 *)((long)pvVar6 + 0xa8) = 0;
      *(undefined8 *)((long)pvVar6 + 0xb0) = 0;
      local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
      local_50._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_50;
      uVar7 = uv_default_loop();
      uv_queue_work(uVar7,pvVar6,submit::anon_class_1_0_00000001::__invoke,
                    submit::anon_class_1_0_00000001::__invoke);
    }
    std::__cxx11::_List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::_M_clear
              (&local_38);
    std::__cxx11::_List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::_M_clear
              (&local_50);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

inline void submit()
    {
        std::list<JobBundle> bundles;
        std::list<JobResult> results;

        m_mutex.lock();
        m_bundles.swap(bundles);
        m_results.swap(results);
        m_mutex.unlock();

        for (const auto &result : results) {
            m_listener->onJobResult(result);
        }

        if (bundles.empty()) {
            return;
        }

        auto baton = new JobBaton(std::move(bundles), m_listener, m_hwAES);

        uv_queue_work(uv_default_loop(), &baton->req,
            [](uv_work_t *req) {
                auto baton = static_cast<JobBaton*>(req->data);

                for (JobBundle &bundle : baton->bundles) {
                    getResults(bundle, baton->results, baton->errors, baton->hwAES);
                }
            },
            [](uv_work_t *req, int) {
                auto baton = static_cast<JobBaton*>(req->data);

                for (const auto &result : baton->results) {
                    baton->listener->onJobResult(result);
                }

                delete baton;
            }
        );
    }